

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSweep.c
# Opt level: O3

void Dch_ManSweepNode(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pRepr;
  void *pvVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  
  ppAVar1 = p->pAigTotal->pReprs;
  if (ppAVar1 != (Aig_Obj_t **)0x0) {
    pRepr = ppAVar1[pObj->Id];
    if (((pRepr != (Aig_Obj_t *)0x0) && ((pObj->field_5).pData != (void *)0x0)) &&
       (pvVar2 = (pRepr->field_5).pData, pvVar2 != (void *)0x0)) {
      pAVar4 = (Aig_Obj_t *)((ulong)(pObj->field_5).pData & 0xfffffffffffffffe);
      if (pAVar4 == (Aig_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe)) {
        p->pReprsProved[pObj->Id] = pRepr;
      }
      else {
        if (p->pAigFraig->pConst1 == pAVar4) {
          __assert_fail("Aig_Regular(pObjFraig) != Aig_ManConst1(p->pAigFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSweep.c"
                        ,0x48,"void Dch_ManSweepNode(Dch_Man_t *, Aig_Obj_t *)");
        }
        iVar3 = Dch_NodesAreEquiv(p,(Aig_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe),pAVar4);
        if (iVar3 == 1) {
          (pObj->field_5).pData =
               (void *)((ulong)((*(uint *)&pRepr->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1)
                       ^ (ulong)pvVar2);
          p->pReprsProved[pObj->Id] = pRepr;
        }
        else if (iVar3 == -1) {
          (pObj->field_5).pData = (void *)0x0;
        }
        else {
          if (p->pPars->fSimulateTfo == 0) {
            Dch_ManResimulateCex2(p,pObj,pRepr);
          }
          else {
            Dch_ManResimulateCex(p,pObj,pRepr);
          }
          ppAVar1 = p->pAigTotal->pReprs;
          if (ppAVar1 == (Aig_Obj_t **)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = ppAVar1[pObj->Id];
          }
          if (pAVar4 == pRepr) {
            __assert_fail("Aig_ObjRepr( p->pAigTotal, pObj ) != pObjRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSweep.c"
                          ,0x5c,"void Dch_ManSweepNode(Dch_Man_t *, Aig_Obj_t *)");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Dch_ManSweepNode( Dch_Man_t * p, Aig_Obj_t * pObj )
{ 
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAigTotal, pObj );
    if ( pObjRepr == NULL )
        return;
    // get the fraiged node
    pObjFraig = Dch_ObjFraig( pObj );
    if ( pObjFraig == NULL )
        return;
    // get the fraiged representative
    pObjReprFraig = Dch_ObjFraig( pObjRepr );
    if ( pObjReprFraig == NULL )
        return;
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
    {
        // remember the proved equivalence
        p->pReprsProved[ pObj->Id ] = pObjRepr;
        return;
    }
    assert( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pAigFraig) );
    RetValue = Dch_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    if ( RetValue == -1 ) // timed out
    {
        Dch_ObjSetFraig( pObj, NULL );
        return;
    }
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Dch_ObjSetFraig( pObj, pObjFraig2 );
        // remember the proved equivalence
        p->pReprsProved[ pObj->Id ] = pObjRepr;
        return;
    }
    // disproved the equivalence
    if ( p->pPars->fSimulateTfo )
        Dch_ManResimulateCex( p, pObj, pObjRepr );
    else
        Dch_ManResimulateCex2( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAigTotal, pObj ) != pObjRepr );
}